

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pl_function.cc
# Opt level: O2

int f(uchar *data,size_t len,void *udata)

{
  ostream *poVar1;
  
  *(int *)udata = *udata + 1;
  poVar1 = std::operator<<((ostream *)&std::cout,"got ");
  poVar1 = std::operator<<(poVar1,(char *)data);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  return (int)(*udata == 3);
}

Assistant:

int
f(unsigned char const* data, size_t len, void* udata)
{
    auto c = reinterpret_cast<Count*>(udata);
    ++c->count;
    std::cout << "got " << data << "(" << len << ")" << std::endl;
    if (c->count == 3) {
        return 1;
    }
    return 0;
}